

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screening_interface.hpp
# Opt level: O0

void ExchCXX::mgga_screening_interface<ExchCXX::BuiltinM062X_C>::eval_exc_vxc_polar
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps,double *vrho_a,
               double *vrho_b,double *vsigma_aa,double *vsigma_ab,double *vsigma_bb,double *vlapl_a,
               double *vlapl_b,double *vtau_a,double *vtau_b)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  double in_XMM0_Qa;
  double sigma_aa_00;
  double sigma_bb_00;
  double in_XMM1_Qa;
  double in_XMM3_Qa;
  double dStack0000000000000008;
  undefined8 *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  double sigma_tol_sq;
  double rho_s;
  double *in_stack_00001828;
  double *in_stack_00001830;
  double *in_stack_00001838;
  double *in_stack_00001840;
  double *in_stack_00001848;
  double *in_stack_00001850;
  double in_stack_00001858;
  double in_stack_00001860;
  double in_stack_00001868;
  double in_stack_00001870;
  double in_stack_00001878;
  double in_stack_00001880;
  double in_stack_00001888;
  double in_stack_00001890;
  double in_stack_000018a0;
  double *in_stack_000018a8;
  double *in_stack_000018b0;
  double *in_stack_000018b8;
  double *in_stack_000018c0;
  double in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  
  *in_RDI = 0;
  *in_RSI = 0;
  *in_RDX = 0;
  *in_RCX = 0;
  *in_R8 = 0;
  *in_R9 = 0;
  *in_stack_00000010 = 0;
  *in_stack_00000018 = 0;
  *in_stack_00000020 = 0;
  *in_stack_00000028 = 0;
  if (1e-12 < in_XMM0_Qa + in_XMM1_Qa) {
    safe_max<double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    safe_max<double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    safe_max<double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    safe_max<double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    safe_max<double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    dStack0000000000000008 = safe_max<double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    sigma_aa_00 = enforce_fermi_hole_curvature<double>
                            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                             8.87100795895708e-318);
    sigma_bb_00 = enforce_fermi_hole_curvature<double>
                            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                             8.87121052587188e-318);
    enforce_polar_sigma_constraints<double>(sigma_aa_00,in_XMM3_Qa,sigma_bb_00);
    safe_max<double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    safe_max<double>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    kernel_traits<ExchCXX::BuiltinM062X_C>::eval_exc_vxc_polar_impl
              (in_stack_00001890,in_stack_00001888,in_stack_00001880,in_stack_00001878,
               in_stack_00001870,in_stack_00001868,in_stack_00001860,in_stack_00001858,
               in_stack_000018a0,in_stack_00001850,in_stack_00001848,in_stack_00001840,
               in_stack_00001838,in_stack_00001830,in_stack_00001828,in_stack_000018a8,
               in_stack_000018b0,in_stack_000018b8,in_stack_000018c0);
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar( double rho_a, double rho_b, double sigma_aa, 
      double sigma_ab, double sigma_bb, double lapl_a, double lapl_b,
      double tau_a, double tau_b, double& eps, double& vrho_a,
      double& vrho_b, double& vsigma_aa, double& vsigma_ab, 
      double& vsigma_bb, double& vlapl_a, double& vlapl_b,
      double& vtau_a, double& vtau_b ) {

    const double rho_s = rho_a + rho_b;
    //const double rho_z = rho_a - rho_b;

    eps       = 0.;
    vrho_a    = 0.;
    vrho_b    = 0.;
    vsigma_aa = 0.;
    vsigma_ab = 0.;
    vsigma_bb = 0.;
    vlapl_a   = 0.;
    vlapl_b   = 0.;
    vtau_a    = 0.;
    vtau_b    = 0.;

    if( rho_s > traits::dens_tol ) {
      constexpr auto sigma_tol_sq = traits::sigma_tol * traits::sigma_tol;
      rho_a    = safe_max(rho_a, traits::dens_tol);
      rho_b    = safe_max(rho_b, traits::dens_tol);
      sigma_aa = safe_max(sigma_aa, sigma_tol_sq); 
      sigma_bb = safe_max(sigma_bb, sigma_tol_sq); 
      tau_a = safe_max(tau_a, traits::tau_tol);
      tau_b = safe_max(tau_b, traits::tau_tol);
      if constexpr (not traits::is_kedf) {
        sigma_aa = enforce_fermi_hole_curvature(sigma_aa, rho_a, tau_a);
        sigma_bb = enforce_fermi_hole_curvature(sigma_bb, rho_b, tau_b);
      }
      sigma_ab = enforce_polar_sigma_constraints(sigma_aa, sigma_ab, sigma_bb);

      traits::eval_exc_vxc_polar_impl( rho_a, rho_b, sigma_aa, sigma_ab, 
        sigma_bb, lapl_a, lapl_b, 
        safe_max(traits::tau_tol, tau_a), 
        safe_max(traits::tau_tol, tau_b), 
        eps, vrho_a, vrho_b, vsigma_aa, vsigma_ab, vsigma_bb, vlapl_a, vlapl_b, 
        vtau_a, vtau_b );
    }

  }